

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O1

Aig_Man_t *
LivenessToSafetyTransformationOneStepLoop
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair,
          Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety)

{
  int *piVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Man_t *p_00;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  Aig_Obj_t *p0;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  Aig_Obj_t *local_50;
  
  iVar13 = p->nRegs;
  if (iVar13 == 0) {
    puts("The input AIG contains no register, returning the original AIG as it is");
    return p;
  }
  uVar16 = p->nTruePis;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar17 = 8;
  if (6 < uVar16) {
    iVar17 = uVar16 + 1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar17;
  if (iVar17 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar17 * 8);
  }
  pVVar3->pArray = ppvVar4;
  vecPis = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar17;
  if (iVar17 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar17 << 3);
  }
  pVVar3->pArray = ppvVar4;
  iVar15 = iVar13 * 2 + vLive->nSize;
  iVar13 = vFair->nSize;
  vecPiNames = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar17 = 8;
  if (6 < (uint)(iVar15 + iVar13)) {
    iVar17 = iVar15 + iVar13 + 1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar17;
  if (iVar17 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar17 * 8);
  }
  pVVar3->pArray = ppvVar4;
  vecLos = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar17;
  if (iVar17 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar17 << 3);
  }
  pVVar3->pArray = ppvVar4;
  vecLoNames = pVVar3;
  p_00 = Aig_ManStart(p->vObjs->nSize * 2);
  pcVar5 = (char *)malloc(10);
  builtin_strncpy(pcVar5,"live2safe",10);
  p_00->pName = pcVar5;
  p_00->pSpec = (char *)0x0;
  pAVar10 = p->pConst1;
  pAVar10->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar14 = 0;
    do {
      if (p->vCis->nSize <= lVar14) goto LAB_005a696c;
      pAVar10 = (Aig_Obj_t *)p->vCis->pArray[lVar14];
      pAVar6 = Aig_ObjCreateCi(p_00);
      (pAVar10->field_5).pData = pAVar6;
      pVVar3 = vecPis;
      uVar16 = vecPis->nCap;
      if (vecPis->nSize == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (vecPis->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vecPis->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          iVar13 = 0x10;
        }
        else {
          iVar13 = uVar16 * 2;
          if (iVar13 <= (int)uVar16) goto LAB_005a60bc;
          if (vecPis->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar16 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vecPis->pArray,(ulong)uVar16 << 4);
          }
          pVVar3->pArray = ppvVar4;
        }
        pVVar3->nCap = iVar13;
      }
LAB_005a60bc:
      iVar13 = pVVar3->nSize;
      pVVar3->nSize = iVar13 + 1;
      pVVar3->pArray[iVar13] = pAVar6;
      if (pNtk->vPis->nSize <= lVar14) goto LAB_005a696c;
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtk->vPis->pArray[lVar14]);
      if (pcVar5 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar5);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pcVar5);
      }
      pVVar3 = vecPiNames;
      uVar16 = vecPiNames->nCap;
      if (vecPiNames->nSize == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vecPiNames->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          iVar13 = 0x10;
        }
        else {
          iVar13 = uVar16 * 2;
          if (iVar13 <= (int)uVar16) goto LAB_005a618f;
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar16 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vecPiNames->pArray,(ulong)uVar16 << 4);
          }
          pVVar3->pArray = ppvVar4;
        }
        pVVar3->nCap = iVar13;
      }
LAB_005a618f:
      iVar13 = pVVar3->nSize;
      pVVar3->nSize = iVar13 + 1;
      pVVar3->pArray[iVar13] = pcVar8;
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nTruePis);
  }
  uVar16 = mode - 3;
  if (uVar16 < 2) {
    local_50 = Aig_ObjCreateCi(p_00);
    pVVar3 = vecPiNames;
    uVar2 = vecPiNames->nCap;
    if (vecPiNames->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(vecPiNames->pArray,0x80);
        }
        pVVar3->pArray = ppvVar4;
        iVar13 = 0x10;
      }
      else {
        iVar13 = uVar2 * 2;
        if (iVar13 <= (int)uVar2) goto LAB_005a6256;
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(vecPiNames->pArray,(ulong)uVar2 << 4);
        }
        pVVar3->pArray = ppvVar4;
      }
      pVVar3->nCap = iVar13;
    }
LAB_005a6256:
    iVar13 = pVVar3->nSize;
    pVVar3->nSize = iVar13 + 1;
    pVVar3->pArray[iVar13] = "SAVE_BIERE";
  }
  else {
    local_50 = (Aig_Obj_t *)0x0;
  }
  if (0 < p->nRegs) {
    iVar13 = 0;
    do {
      uVar2 = p->nTruePis + iVar13;
      if (((int)uVar2 < 0) || (p->vCis->nSize <= (int)uVar2)) goto LAB_005a696c;
      pAVar10 = (Aig_Obj_t *)p->vCis->pArray[uVar2];
      pAVar6 = Aig_ObjCreateCi(p_00);
      (pAVar10->field_5).pData = pAVar6;
      pVVar3 = vecLos;
      uVar2 = vecLos->nCap;
      if (vecLos->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          iVar17 = 0x10;
        }
        else {
          iVar17 = uVar2 * 2;
          if (iVar17 <= (int)uVar2) goto LAB_005a632a;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vecLos->pArray,(ulong)uVar2 << 4);
          }
          pVVar3->pArray = ppvVar4;
        }
        pVVar3->nCap = iVar17;
      }
LAB_005a632a:
      iVar17 = pVVar3->nSize;
      pVVar3->nSize = iVar17 + 1;
      pVVar3->pArray[iVar17] = pAVar6;
      uVar2 = pNtk->vPis->nSize + iVar13;
      if (((int)uVar2 < 0) || (pNtk->vCis->nSize <= (int)uVar2)) goto LAB_005a696c;
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar2]);
      if (pcVar5 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar5);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pcVar5);
      }
      pVVar3 = vecLoNames;
      uVar2 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          iVar17 = 0x10;
        }
        else {
          iVar17 = uVar2 * 2;
          if (iVar17 <= (int)uVar2) goto LAB_005a640b;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vecLoNames->pArray,(ulong)uVar2 << 4);
          }
          pVVar3->pArray = ppvVar4;
        }
        pVVar3->nCap = iVar17;
      }
LAB_005a640b:
      iVar17 = pVVar3->nSize;
      pVVar3->nSize = iVar17 + 1;
      pVVar3->pArray[iVar17] = pcVar8;
      iVar13 = iVar13 + 1;
    } while (iVar13 < p->nRegs);
  }
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar14 = 0;
    do {
      pAVar10 = (Aig_Obj_t *)pVVar3->pArray[lVar14];
      if ((pAVar10 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar10->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar10 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar9 = (ulong)pAVar10->pFanin0 & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)((ulong)((uint)pAVar10->pFanin0 & 1) ^ *(ulong *)(uVar9 + 0x28));
        }
        uVar9 = (ulong)pAVar10->pFanin1 & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar11 = (Aig_Obj_t *)((ulong)((uint)pAVar10->pFanin1 & 1) ^ *(ulong *)(uVar9 + 0x28));
        }
        pAVar6 = Aig_And(p_00,pAVar6,pAVar11);
        (pAVar10->field_5).pData = pAVar6;
      }
      lVar14 = lVar14 + 1;
      pVVar3 = p->vObjs;
    } while (lVar14 < pVVar3->nSize);
  }
  if ((mode == 4) || (mode == 1)) {
    if (vAssertSafety->nSize == 0) {
LAB_005a6547:
      puts("No safety property is specified, hence no safety gate is created");
    }
    else if (vAssumeSafety->nSize == 0) {
      if (vAssertSafety->nSize < 1) {
        pAVar6 = (Aig_Obj_t *)0x1;
      }
      else {
        lVar14 = 0;
        pAVar11 = (Aig_Obj_t *)0x0;
        do {
          pAVar10 = (Aig_Obj_t *)vAssertSafety->pArray[lVar14];
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar10->pFanin0 & 1) ^
                   *(ulong *)(((ulong)pAVar10->pFanin0 & 0xfffffffffffffffe) + 0x28));
          if (pAVar11 != (Aig_Obj_t *)0x0) {
            pAVar6 = Aig_And(p_00,pAVar6,pAVar11);
          }
          lVar14 = lVar14 + 1;
          pAVar11 = pAVar6;
        } while (lVar14 < vAssertSafety->nSize);
        pAVar6 = (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
      }
      Aig_ObjCreateCo(p_00,pAVar6);
    }
    else {
      if ((vAssertSafety->nSize == 0) || (vAssumeSafety->nSize == 0)) goto LAB_005a6547;
      if (vAssertSafety->nSize < 1) {
        pAVar6 = (Aig_Obj_t *)0x1;
      }
      else {
        lVar14 = 0;
        pAVar11 = (Aig_Obj_t *)0x0;
        do {
          pAVar10 = (Aig_Obj_t *)vAssertSafety->pArray[lVar14];
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar10->pFanin0 & 1) ^
                   *(ulong *)(((ulong)pAVar10->pFanin0 & 0xfffffffffffffffe) + 0x28));
          if (pAVar11 != (Aig_Obj_t *)0x0) {
            pAVar6 = Aig_And(p_00,pAVar6,pAVar11);
          }
          lVar14 = lVar14 + 1;
          pAVar11 = pAVar6;
        } while (lVar14 < vAssertSafety->nSize);
        pAVar6 = (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
      }
      if (vAssumeSafety->nSize < 1) {
        pAVar11 = (Aig_Obj_t *)0x0;
      }
      else {
        lVar14 = 0;
        pAVar12 = (Aig_Obj_t *)0x0;
        do {
          pAVar10 = (Aig_Obj_t *)vAssumeSafety->pArray[lVar14];
          pAVar11 = (Aig_Obj_t *)
                    ((ulong)((uint)pAVar10->pFanin0 & 1) ^
                    *(ulong *)(((ulong)pAVar10->pFanin0 & 0xfffffffffffffffe) + 0x28));
          if (pAVar12 != (Aig_Obj_t *)0x0) {
            pAVar11 = Aig_And(p_00,pAVar11,pAVar12);
          }
          lVar14 = lVar14 + 1;
          pAVar12 = pAVar11;
        } while (lVar14 < vAssumeSafety->nSize);
      }
      pAVar6 = Aig_And(p_00,pAVar6,pAVar11);
      Aig_ObjCreateCo(p_00,pAVar6);
    }
  }
  iVar13 = 0;
  if (uVar16 < 2) {
    pAVar10 = Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                                    (((ulong)pAVar10->pFanin0 & 0xfffffffffffffffe) + 0x28));
  }
  else {
    pAVar10 = (Aig_Obj_t *)0x0;
  }
  if (0 < p->nRegs) {
    iVar13 = 0;
    do {
      iVar17 = p->nTruePis;
      uVar2 = iVar13 + iVar17;
      if (((int)uVar2 < 0) || (p->vCis->nSize <= (int)uVar2)) goto LAB_005a696c;
      piVar1 = (int *)p->vCis->pArray[uVar2];
      if (((piVar1[6] & 7U) != 2) || (iVar15 = *piVar1, iVar15 < iVar17)) goto LAB_005a698b;
      uVar2 = (iVar15 - iVar17) + p->nTruePos;
      if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) goto LAB_005a696c;
      uVar9 = *(ulong *)((long)p->vCos->pArray[uVar2] + 8);
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)((uint)uVar9 & 1) ^
                           *(ulong *)((uVar9 & 0xfffffffffffffffe) + 0x28)));
      iVar13 = iVar13 + 1;
    } while (iVar13 < p->nRegs);
  }
  if (1 < uVar16) goto LAB_005a681e;
  iVar17 = 0;
  if (p->nRegs < 1) {
    pAVar6 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar11 = (Aig_Obj_t *)0x0;
    do {
      iVar15 = p->nTruePis;
      uVar16 = iVar17 + iVar15;
      if (((int)uVar16 < 0) || (p->vCis->nSize <= (int)uVar16)) {
LAB_005a696c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar1 = (int *)p->vCis->pArray[uVar16];
      if (((piVar1[6] & 7U) != 2) || (*piVar1 < iVar15)) {
LAB_005a698b:
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar16 = (*piVar1 - iVar15) + p->nTruePos;
      if (((int)uVar16 < 0) || (p->vCos->nSize <= (int)uVar16)) goto LAB_005a696c;
      uVar9 = *(ulong *)((long)p->vCos->pArray[uVar16] + 8);
      pAVar6 = Aig_Exor(p_00,*(Aig_Obj_t **)(piVar1 + 10),
                        (Aig_Obj_t *)
                        ((ulong)((uint)uVar9 & 1) ^ *(ulong *)((uVar9 & 0xfffffffffffffffe) + 0x28))
                       );
      pAVar6 = (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
      if (pAVar11 != (Aig_Obj_t *)0x0) {
        pAVar6 = Aig_And(p_00,pAVar6,pAVar11);
      }
      iVar17 = iVar17 + 1;
      pAVar11 = pAVar6;
    } while (iVar17 < p->nRegs);
  }
  pAVar6 = Aig_And(p_00,local_50,pAVar6);
  if ((vLive == (Vec_Ptr_t *)0x0) || (vLive->nSize == 0)) {
    puts("Circuit without any liveness property");
    pAVar11 = (Aig_Obj_t *)0x0;
  }
  else if (vLive->nSize < 1) {
    pAVar11 = (Aig_Obj_t *)0x0;
  }
  else {
    lVar14 = 0;
    pAVar11 = (Aig_Obj_t *)0x0;
    do {
      uVar9 = *(ulong *)((long)vLive->pArray[lVar14] + 8);
      pAVar12 = (Aig_Obj_t *)
                ((ulong)((uint)uVar9 & 1) ^ *(ulong *)((uVar9 & 0xfffffffffffffffe) + 0x28));
      if (pAVar11 != (Aig_Obj_t *)0x0) {
        pAVar12 = Aig_And(p_00,pAVar12,pAVar11);
      }
      pAVar11 = pAVar12;
      lVar14 = lVar14 + 1;
    } while (lVar14 < vLive->nSize);
  }
  if (pAVar11 == (Aig_Obj_t *)0x0) {
    pAVar11 = p_00->pConst1;
  }
  if ((vFair == (Vec_Ptr_t *)0x0) || (vFair->nSize == 0)) {
    puts("Circuit without any fairness property");
LAB_005a67e1:
    pAVar12 = (Aig_Obj_t *)0x0;
  }
  else {
    if (vFair->nSize < 1) goto LAB_005a67e1;
    lVar14 = 0;
    pAVar12 = (Aig_Obj_t *)0x0;
    do {
      uVar9 = *(ulong *)((long)vFair->pArray[lVar14] + 8);
      p0 = (Aig_Obj_t *)((ulong)((uint)uVar9 & 1) ^ *(ulong *)((uVar9 & 0xfffffffffffffffe) + 0x28))
      ;
      if (pAVar12 != (Aig_Obj_t *)0x0) {
        p0 = Aig_And(p_00,p0,pAVar12);
      }
      pAVar12 = p0;
      lVar14 = lVar14 + 1;
    } while (lVar14 < vFair->nSize);
  }
  if (pAVar12 == (Aig_Obj_t *)0x0) {
    pAVar12 = p_00->pConst1;
  }
  pAVar11 = Aig_And(p_00,pAVar12,(Aig_Obj_t *)((ulong)pAVar11 ^ 1));
  pAVar6 = Aig_And(p_00,pAVar6,pAVar11);
  Aig_ObjPatchFanin0(p_00,pAVar10,pAVar6);
LAB_005a681e:
  Aig_ManSetRegNum(p_00,iVar13);
  iVar13 = p_00->vCis->nSize;
  p_00->nObjs[2] = iVar13;
  iVar17 = p_00->nRegs;
  if (iVar17 != 0) {
    p_00->nTruePis = iVar13 - iVar17;
  }
  iVar13 = p_00->vCos->nSize;
  p_00->nObjs[3] = iVar13;
  if (iVar17 != 0) {
    p_00->nTruePos = iVar13 - iVar17;
  }
  Aig_ManCleanup(p_00);
  iVar13 = Aig_ManCheck(p_00);
  if (iVar13 != 0) {
    return p_00;
  }
  __assert_fail("Aig_ManCheck( pNew )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/liveness.c"
                ,0x470,
                "Aig_Man_t *LivenessToSafetyTransformationOneStepLoop(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationOneStepLoop( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, 
													  Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety )
{
	Aig_Man_t * pNew;
	int i, nRegCount;
	Aig_Obj_t * pObjSavePi = NULL;
	Aig_Obj_t *pObj, *pMatch;
	Aig_Obj_t *pObjSavedLoAndEquality;
	Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc, *pObjAndAccDummy;
	Aig_Obj_t *pObjLive, *pObjFair, *pObjSafetyGate;
	Aig_Obj_t *pObjSafetyPropertyOutput = NULL;
	Aig_Obj_t *pDriverImage;
	Aig_Obj_t *pObjCorrespondingLi;
	Aig_Obj_t *pArgument;
	Aig_Obj_t *collectiveAssertSafety, *collectiveAssumeSafety;

	char *nodeName;
	int piCopied = 0, liCopied = 0, loCopied = 0;//, liCreated = 0, loCreated = 0, piVecIndex = 0;

	if( Aig_ManRegNum( p ) == 0 )
	{
		printf("The input AIG contains no register, returning the original AIG as it is\n");
		return p;
	}

	vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
	vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

	vecLos = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
	vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
	pNew->pName = Abc_UtilStrsav( "live2safe" );
    pNew->pSpec = NULL;
    
	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );

	//****************************************************************
    // Step 3: create true PIs
	//****************************************************************
    Saig_ManForEachPi( p, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecPis, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
		Vec_PtrPush( vecPiNames, nodeName );
	}

	//****************************************************************
	// Step 4: create the special Pi corresponding to SAVE
	//****************************************************************
	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		pObjSavePi = Aig_ObjCreateCi( pNew );
		nodeName = "SAVE_BIERE",
		Vec_PtrPush( vecPiNames, nodeName );
	}
			
	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    Saig_ManForEachLo( p, pObj, i )
    {
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNew);
		Vec_PtrPush( vecLos, pObj->pData );
		nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
		Vec_PtrPush( vecLoNames, nodeName );
    }

	//****************************************************************
	// Step 6: create "saved" register output
	//****************************************************************

#if 0
	loCreated++;
	pObjSavedLo = Aig_ObjCreateCi( pNew );
	Vec_PtrPush( vecLos, pObjSavedLo );
	nodeName = "SAVED_LO";
	Vec_PtrPush( vecLoNames, nodeName );
#endif

	//****************************************************************
	// Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
	//****************************************************************
#if 0
	pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
	pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
#endif

	//********************************************************************
	// Step 8: create internal nodes
	//********************************************************************
    Aig_ManForEachNode( p, pObj, i )
	{
		pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

#if 0
	//********************************************************************
	// Step 8.x : create PO for each safety assertions
	//********************************************************************
	Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
	}
#endif

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
	{
		if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
		{
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
		}
		else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
		{
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			collectiveAssertSafety = pObjAndAcc;
			pObjAndAcc = NULL;
			Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
			{
				//pObj->pData = Aig_ObjCreateCo( pNew, Aig_NotCond(Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) ) );
				pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
				if( pObjAndAcc == NULL )
					pObjAndAcc = pArgument;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAccDummy );
				}
			}
			collectiveAssumeSafety = pObjAndAcc;
			Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
		}
		else
			printf("No safety property is specified, hence no safety gate is created\n");
	}

	//********************************************************************
	// Step 9: create the safety property output gate
	// create the safety property output gate, this will be the sole true PO 
	// of the whole circuit, discuss with Sat/Alan for an alternative implementation
	//********************************************************************

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
	}

	// create register inputs for the original registers
    nRegCount = 0;
	
	Saig_ManForEachLo( p, pObj, i )
    {
		pMatch = Saig_ObjLoToLi( p, pObj );
        //Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch) );
		Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
        nRegCount++;
		liCopied++;
    }

#if 0
	// create register input corresponding to the register "saved"
	pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
	nRegCount++;
	liCreated++;7
#endif

	pObjAndAcc = NULL;

	//****************************************************************************************************
	//For detection of loop of length 1 we do not need any shadow register, we only need equality detector
	//between Lo_j and Li_j and then a cascade of AND gates
	//****************************************************************************************************

	if( mode == FULL_BIERE_ONE_LOOP_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_ONE_LOOP_MODE )
	{
		Saig_ManForEachLo( p, pObj, i )
		{
			pObjCorrespondingLi = Saig_ObjLoToLi( p, pObj );
		
			pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData,  Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0( pObjCorrespondingLi )->pData, Aig_ObjFaninC0( pObjCorrespondingLi ) ) );
			pObjXnor = Aig_Not( pObjXor );
		
			if( pObjAndAcc == NULL )
				pObjAndAcc = pObjXnor;
			else
			{
				pObjAndAccDummy = pObjAndAcc;
				pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAccDummy );
			}
		}

		// create the AND gate whose output will be the signal "looped"
		pObjSavedLoAndEquality = Aig_And( pNew, pObjSavePi, pObjAndAcc );
	
		// create the master AND gate and corresponding AND and OR logic for the liveness properties
		pObjAndAcc = NULL;
		if( vLive == NULL || Vec_PtrSize( vLive ) == 0 )
			printf("Circuit without any liveness property\n");
		else
		{
			Vec_PtrForEachEntry( Aig_Obj_t *, vLive, pObj, i )
			{
				pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
				if( pObjAndAcc == NULL )
					pObjAndAcc = pDriverImage;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pDriverImage, pObjAndAccDummy );
				}
			}
		}

		if( pObjAndAcc != NULL )
			pObjLive = pObjAndAcc;
		else
			pObjLive = Aig_ManConst1( pNew );
	
		// create the master AND gate and corresponding AND and OR logic for the fairness properties
		pObjAndAcc = NULL;
		if( vFair == NULL || Vec_PtrSize( vFair ) == 0 )
			printf("Circuit without any fairness property\n");
		else
		{
			Vec_PtrForEachEntry( Aig_Obj_t *, vFair, pObj, i )
			{
				pDriverImage = Aig_NotCond((Aig_Obj_t *)Aig_Regular(Aig_ObjChild0( pObj ))->pData, Aig_ObjFaninC0(pObj));
				if( pObjAndAcc == NULL )
					pObjAndAcc = pDriverImage;
				else
				{
					pObjAndAccDummy = pObjAndAcc;
					pObjAndAcc = Aig_And( pNew, pDriverImage, pObjAndAccDummy );
				}
			}
		}

		if( pObjAndAcc != NULL )
			pObjFair = pObjAndAcc;
		else
			pObjFair = Aig_ManConst1( pNew );
	
		pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_And( pNew, pObjFair, Aig_Not( pObjLive ) ) );
	
		Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
	}

	Aig_ManSetRegNum( pNew, nRegCount );

	//printf("\nSaig_ManPiNum = %d, Reg Num = %d, before everything, before Pi cleanup\n", Vec_PtrSize( pNew->vPis ), pNew->nRegs );

	Aig_ManCiCleanupBiere( pNew );
	Aig_ManCoCleanupBiere( pNew );

	Aig_ManCleanup( pNew );
	
	assert( Aig_ManCheck( pNew ) );
	
	return pNew;
}